

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O0

void anon_unknown.dwarf_e2799::testDct(void)

{
  ostream *poVar1;
  SimdAlignedBuffer64f *src;
  ostream *this;
  double dVar2;
  int i_25;
  int iter_25;
  int i_24;
  int iter_24;
  int i_23;
  int iter_23;
  int i_22;
  int iter_22;
  int i_21;
  int iter_21;
  int i_20;
  int iter_20;
  int i_19;
  int iter_19;
  int i_18;
  int iter_18;
  int i_17;
  int iter_17;
  int i_16;
  int iter_16;
  int i_15;
  int iter_15;
  int i_14;
  int iter_14;
  int i_13;
  int iter_13;
  int i_12;
  int iter_12;
  int i_11;
  int iter_11;
  int i_10;
  int iter_10;
  CpuId cpuid;
  int i_9;
  int iter_9;
  int i_8;
  int iter_8;
  int i_7;
  int iter_7;
  int i_6;
  int iter_6;
  int i_5;
  int iter_5;
  int i_4;
  int iter_4;
  int i_3;
  int iter_3;
  int i_2;
  int iter_2;
  int i_1;
  int iter_1;
  int i;
  int iter;
  SimdAlignedBuffer64f test;
  SimdAlignedBuffer64f orig;
  Rand48 rand48;
  int numIter;
  unsigned_long in_stack_fffffffffffffc68;
  SimdAlignedBuffer64<float> *in_stack_fffffffffffffc70;
  CpuId *in_stack_fffffffffffffc80;
  SimdAlignedBuffer64f *in_stack_fffffffffffffc88;
  SimdAlignedBuffer64f *in_stack_fffffffffffffc90;
  float *in_stack_fffffffffffffcd0;
  float *in_stack_fffffffffffffce8;
  float *in_stack_fffffffffffffdc8;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int local_e0;
  int local_dc;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar3;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  byte local_93;
  byte local_8e;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  float *local_30;
  float *local_20;
  
  Imath_2_5::Rand48::Rand48((Rand48 *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64((SimdAlignedBuffer64<float> *)0x181f00);
  Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64((SimdAlignedBuffer64<float> *)0x181f0d);
  poVar1 = std::operator<<((ostream *)&std::cout,"   DCT Round Trip ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_40 = 0; local_40 < 1000000; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x181f84);
      local_30[local_44] = (float)dVar2;
      local_20[local_44] = (float)dVar2;
    }
    Imf_2_5::anon_unknown_2::dctForward8x8(in_stack_fffffffffffffdc8);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"      Inverse, DC Only");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_48 = 0; local_48 < 1000000; local_48 = local_48 + 1) {
    dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x1820d1);
    *local_30 = (float)dVar2;
    *local_20 = (float)dVar2;
    for (local_4c = 1; local_4c < 0x40; local_4c = local_4c + 1) {
      local_30[local_4c] = 0.0;
      local_20[local_4c] = 0.0;
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8DcOnly(local_30);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"      Inverse, Scalar: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"8x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_50 = 0; local_50 < 1000000; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < 0x40; local_54 = local_54 + 1) {
      if (local_54 < 0x40) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182286);
        local_30[local_54] = (float)dVar2;
        local_20[local_54] = (float)dVar2;
      }
      else {
        local_30[local_54] = 0.0;
        local_20[local_54] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"7x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_58 = 0; local_58 < 1000000; local_58 = local_58 + 1) {
    for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 1) {
      if (local_5c < 0x38) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x18240c);
        local_30[local_5c] = (float)dVar2;
        local_20[local_5c] = (float)dVar2;
      }
      else {
        local_30[local_5c] = 0.0;
        local_20[local_5c] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<1>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"6x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_60 = 0; local_60 < 1000000; local_60 = local_60 + 1) {
    for (local_64 = 0; local_64 < 0x40; local_64 = local_64 + 1) {
      if (local_64 < 0x30) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182592);
        local_30[local_64] = (float)dVar2;
        local_20[local_64] = (float)dVar2;
      }
      else {
        local_30[local_64] = 0.0;
        local_20[local_64] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<2>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"5x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_68 = 0; local_68 < 1000000; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < 0x40; local_6c = local_6c + 1) {
      if (local_6c < 0x28) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182718);
        local_30[local_6c] = (float)dVar2;
        local_20[local_6c] = (float)dVar2;
      }
      else {
        local_30[local_6c] = 0.0;
        local_20[local_6c] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<3>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"4x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_70 = 0; local_70 < 1000000; local_70 = local_70 + 1) {
    for (local_74 = 0; local_74 < 0x40; local_74 = local_74 + 1) {
      if (local_74 < 0x20) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x18289e);
        local_30[local_74] = (float)dVar2;
        local_20[local_74] = (float)dVar2;
      }
      else {
        local_30[local_74] = 0.0;
        local_20[local_74] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<4>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"3x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_78 = 0; local_78 < 1000000; local_78 = local_78 + 1) {
    for (local_7c = 0; local_7c < 0x40; local_7c = local_7c + 1) {
      if (local_7c < 0x18) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182a24);
        local_30[local_7c] = (float)dVar2;
        local_20[local_7c] = (float)dVar2;
      }
      else {
        local_30[local_7c] = 0.0;
        local_20[local_7c] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<5>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"2x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_80 = 0; local_80 < 1000000; local_80 = local_80 + 1) {
    for (local_84 = 0; local_84 < 0x40; local_84 = local_84 + 1) {
      if (local_84 < 0x10) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182baa);
        local_30[local_84] = (float)dVar2;
        local_20[local_84] = (float)dVar2;
      }
      else {
        local_30[local_84] = 0.0;
        local_20[local_84] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<6>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"1x8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_88 = 0; local_88 < 1000000; local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < 0x40; local_8c = local_8c + 1) {
      if (local_8c < 8) {
        dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182d30);
        local_30[local_8c] = (float)dVar2;
        local_20[local_8c] = (float)dVar2;
      }
      else {
        local_30[local_8c] = 0.0;
        local_20[local_8c] = 0.0;
      }
    }
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
    Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<7>(in_stack_fffffffffffffcd0);
    compareBufferRelative
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),SUB84(in_stack_fffffffffffffc80,0))
    ;
  }
  Imf_2_5::CpuId::CpuId(in_stack_fffffffffffffc80);
  if ((local_93 & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"      Inverse, SSE2: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"8x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_98 = 0; local_98 < 1000000; local_98 = local_98 + 1) {
      for (local_9c = 0; local_9c < 0x40; local_9c = local_9c + 1) {
        if (local_9c < 0x40) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x182f06);
          local_30[local_9c] = (float)dVar2;
          local_20[local_9c] = (float)dVar2;
        }
        else {
          local_30[local_9c] = 0.0;
          local_20[local_9c] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<0>
                ((float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"7x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_a0 = 0; local_a0 < 1000000; local_a0 = local_a0 + 1) {
      for (local_a4 = 0; local_a4 < 0x40; local_a4 = local_a4 + 1) {
        if (local_a4 < 0x38) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x18308c);
          local_30[local_a4] = (float)dVar2;
          local_20[local_a4] = (float)dVar2;
        }
        else {
          local_30[local_a4] = 0.0;
          local_20[local_a4] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<1>
                ((float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"6x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_a8 = 0; local_a8 < 1000000; local_a8 = local_a8 + 1) {
      for (local_ac = 0; local_ac < 0x40; local_ac = local_ac + 1) {
        if (local_ac < 0x30) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x183212);
          local_30[local_ac] = (float)dVar2;
          local_20[local_ac] = (float)dVar2;
        }
        else {
          local_30[local_ac] = 0.0;
          local_20[local_ac] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<2>
                ((float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"5x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_b0 = 0; local_b0 < 1000000; local_b0 = local_b0 + 1) {
      for (local_b4 = 0; local_b4 < 0x40; local_b4 = local_b4 + 1) {
        if (local_b4 < 0x28) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x183398);
          local_30[local_b4] = (float)dVar2;
          local_20[local_b4] = (float)dVar2;
        }
        else {
          local_30[local_b4] = 0.0;
          local_20[local_b4] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<3>
                ((float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"4x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_b8 = 0; local_b8 < 1000000; local_b8 = local_b8 + 1) {
      for (local_bc = 0; local_bc < 0x40; local_bc = local_bc + 1) {
        if (local_bc < 0x20) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x18351e);
          local_30[local_bc] = (float)dVar2;
          local_20[local_bc] = (float)dVar2;
        }
        else {
          local_30[local_bc] = 0.0;
          local_20[local_bc] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<4>
                ((float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"3x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_c0 = 0; local_c0 < 1000000; local_c0 = local_c0 + 1) {
      for (local_c4 = 0; local_c4 < 0x40; local_c4 = local_c4 + 1) {
        if (local_c4 < 0x18) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x1836a4);
          local_30[local_c4] = (float)dVar2;
          local_20[local_c4] = (float)dVar2;
        }
        else {
          local_30[local_c4] = 0.0;
          local_20[local_c4] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<5>
                ((float *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"2x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_c8 = 0; local_c8 < 1000000; local_c8 = local_c8 + 1) {
      for (local_cc = 0; local_cc < 0x40; local_cc = local_cc + 1) {
        if (local_cc < 0x10) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x18382a);
          local_30[local_cc] = (float)dVar2;
          local_20[local_cc] = (float)dVar2;
        }
        else {
          local_30[local_cc] = 0.0;
          local_20[local_cc] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<6>
                ((float *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"1x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_d0 = 0; local_d0 < 1000000; local_d0 = local_d0 + 1) {
      for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
        if (iVar3 < 8) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x1839b0);
          local_30[iVar3] = (float)dVar2;
          local_20[iVar3] = (float)dVar2;
        }
        else {
          local_30[iVar3] = 0.0;
          local_20[iVar3] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_sse2<7>
                ((float *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
  }
  if ((local_8e & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"      Inverse, AVX: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"8x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (iVar3 = 0; iVar3 < 1000000; iVar3 = iVar3 + 1) {
      for (local_dc = 0; local_dc < 0x40; local_dc = local_dc + 1) {
        if (local_dc < 0x40) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x183b79);
          local_30[local_dc] = (float)dVar2;
          local_20[local_dc] = (float)dVar2;
        }
        else {
          local_30[local_dc] = 0.0;
          local_20[local_dc] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<0>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"7x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_e0 = 0; local_e0 < 1000000; local_e0 = local_e0 + 1) {
      for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
        if (iVar3 < 0x38) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x183cff);
          local_30[iVar3] = (float)dVar2;
          local_20[iVar3] = (float)dVar2;
        }
        else {
          local_30[iVar3] = 0.0;
          local_20[iVar3] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<1>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"6x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (iVar3 = 0; iVar3 < 1000000; iVar3 = iVar3 + 1) {
      for (local_ec = 0; local_ec < 0x40; local_ec = local_ec + 1) {
        if (local_ec < 0x30) {
          in_stack_fffffffffffffce8 = (float *)Imath_2_5::Rand48::nextf((Rand48 *)0x183e85);
          local_30[local_ec] = (float)(double)in_stack_fffffffffffffce8;
          local_20[local_ec] = (float)(double)in_stack_fffffffffffffce8;
        }
        else {
          local_30[local_ec] = 0.0;
          local_20[local_ec] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<2>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"5x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_f0 = 0; local_f0 < 1000000; local_f0 = local_f0 + 1) {
      for (local_f4 = 0; local_f4 < 0x40; local_f4 = local_f4 + 1) {
        if (local_f4 < 0x28) {
          in_stack_fffffffffffffcd0 = (float *)Imath_2_5::Rand48::nextf((Rand48 *)0x183fff);
          local_30[local_f4] = (float)(double)in_stack_fffffffffffffcd0;
          local_20[local_f4] = (float)(double)in_stack_fffffffffffffcd0;
        }
        else {
          local_30[local_f4] = 0.0;
          local_20[local_f4] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<3>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"4x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_f8 = 0; local_f8 < 1000000; local_f8 = local_f8 + 1) {
      for (local_fc = 0; local_fc < 0x40; local_fc = local_fc + 1) {
        if (local_fc < 0x20) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x184173);
          local_30[local_fc] = (float)dVar2;
          local_20[local_fc] = (float)dVar2;
        }
        else {
          local_30[local_fc] = 0.0;
          local_20[local_fc] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<4>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    poVar1 = std::operator<<(poVar1,"3x8");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_100 = 0; local_100 < 1000000; local_100 = local_100 + 1) {
      for (local_104 = 0; local_104 < 0x40; local_104 = local_104 + 1) {
        if (local_104 < 0x18) {
          dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x1842e7);
          local_30[local_104] = (float)dVar2;
          local_20[local_104] = (float)dVar2;
        }
        else {
          local_30[local_104] = 0.0;
          local_20[local_104] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<5>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    src = (SimdAlignedBuffer64f *)std::operator<<(poVar1,"2x8");
    std::ostream::operator<<(src,std::endl<char,std::char_traits<char>>);
    for (local_108 = 0; local_108 < 1000000; local_108 = local_108 + 1) {
      for (local_10c = 0; local_10c < 0x40; local_10c = local_10c + 1) {
        if (local_10c < 0x10) {
          in_stack_fffffffffffffc88 =
               (SimdAlignedBuffer64f *)Imath_2_5::Rand48::nextf((Rand48 *)0x18445b);
          local_30[local_10c] = (float)(double)in_stack_fffffffffffffc88;
          local_20[local_10c] = (float)(double)in_stack_fffffffffffffc88;
        }
        else {
          local_30[local_10c] = 0.0;
          local_20[local_10c] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<6>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (src,in_stack_fffffffffffffc88,(float)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 SUB84(in_stack_fffffffffffffc80,0));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"         ");
    this = std::operator<<(poVar1,"1x8");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    for (local_110 = 0; local_110 < 1000000; local_110 = local_110 + 1) {
      for (local_114 = 0; local_114 < 0x40; local_114 = local_114 + 1) {
        if (local_114 < 8) {
          in_stack_fffffffffffffc70 =
               (SimdAlignedBuffer64<float> *)Imath_2_5::Rand48::nextf((Rand48 *)0x1845cf);
          local_30[local_114] = (float)(double)in_stack_fffffffffffffc70;
          local_20[local_114] = (float)(double)in_stack_fffffffffffffc70;
        }
        else {
          local_30[local_114] = 0.0;
          local_20[local_114] = 0.0;
        }
      }
      Imf_2_5::anon_unknown_2::dctInverse8x8_scalar<0>(in_stack_fffffffffffffcd0);
      Imf_2_5::anon_unknown_2::dctInverse8x8_avx<7>(in_stack_fffffffffffffce8);
      compareBufferRelative
                (src,in_stack_fffffffffffffc88,(float)((ulong)poVar1 >> 0x20),SUB84(poVar1,0));
    }
  }
  Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(in_stack_fffffffffffffc70);
  Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(in_stack_fffffffffffffc70);
  return;
}

Assistant:

void
testDct()
{
    const int            numIter = 1000000;
    Rand48               rand48(0);
    SimdAlignedBuffer64f orig;
    SimdAlignedBuffer64f test;
   
    cout << "   DCT Round Trip " << endl;
    for (int iter=0; iter<numIter; ++iter) 
    {
        for (int i=0; i<64; ++i) 
        {
            orig._buffer[i] = test._buffer[i] = rand48.nextf();
        }

        dctForward8x8(test._buffer);
        dctInverse8x8_scalar<0>(test._buffer);

        compareBufferRelative(orig, test, .02, 1e-3);
    } 

    cout << "      Inverse, DC Only" << endl;
    for (int iter=0; iter<numIter; ++iter) 
    {
        orig._buffer[0] = test._buffer[0] = rand48.nextf();
        for (int i=1; i<64; ++i) 
        {
            orig._buffer[i] = test._buffer[i] = 0;
        }

        dctInverse8x8_scalar<0>(orig._buffer);
        dctInverse8x8DcOnly(test._buffer);

        compareBufferRelative(orig, test, .01, 1e-6);
    } 


#define INVERSE_DCT_SCALAR_TEST_N(_func, _n, _desc)                \
    cout << "         " << _desc << endl;                          \
    for (int iter=0; iter<numIter; ++iter)                         \
    {                                                              \
        for (int i=0; i<64; ++i)                                   \
        {                                                          \
            if (i < 8*(8-_n))                                      \
            {                                                      \
               orig._buffer[i] = test._buffer[i] = rand48.nextf(); \
            } else {                                               \
               orig._buffer[i] = test._buffer[i] = 0;              \
            }                                                      \
        }                                                          \
        dctInverse8x8_scalar<0>(orig._buffer);                     \
        _func<_n>(test._buffer);                                   \
        compareBufferRelative(orig, test, .01, 1e-6);              \
    }

    cout << "      Inverse, Scalar: " << endl;
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 0, "8x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 1, "7x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 2, "6x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 3, "5x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 4, "4x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 5, "3x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 6, "2x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 7, "1x8")

    CpuId cpuid;
    if (cpuid.sse2) 
    {
        cout << "      Inverse, SSE2: " << endl;
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 7, "1x8")
    }

    if (cpuid.avx) 
    {
        cout << "      Inverse, AVX: " << endl;
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 7, "1x8")
    }
}